

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::read_shape
          (basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,uint8_t info,
          error_code *ec)

{
  pointer puVar1;
  value_type *pvVar2;
  size_t in_RAX;
  size_t sVar3;
  size_t i;
  ulong uVar4;
  size_t dim;
  
  puVar1 = (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->shape_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  dim = in_RAX;
  if (info == '\x1f') {
    while (pvVar2 = (this->source_).current_, pvVar2 < (this->source_).end_) {
      if (*pvVar2 == 0xff) {
        (this->source_).current_ = pvVar2 + 1;
      }
      else {
        dim = get_size(this,ec);
        if (ec->_M_value != 0) {
          return;
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->shape_,&dim);
      }
    }
    std::error_code::operator=(ec,unexpected_eof);
    this->more_ = false;
  }
  else {
    sVar3 = get_size(this,ec);
    if (ec->_M_value == 0) {
      uVar4 = 0;
      while (((this->more_ == true && (uVar4 < sVar3)) &&
             (dim = get_size(this,ec), ec->_M_value == 0))) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->shape_,&dim);
        uVar4 = uVar4 + 1;
      }
    }
  }
  return;
}

Assistant:

void read_shape(uint8_t info, std::error_code& ec)
    {
        shape_.clear();
        switch (info)
        {
            case jsoncons::cbor::detail::additional_info::indefinite_length:
            {
                while (true)
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = cbor_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == 0xff)
                    {
                        source_.ignore(1);
                    }
                    else
                    {
                        std::size_t dim = get_size(ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        shape_.push_back(dim);
                    }
                }
                break;
            }
            default:
            {
                std::size_t size = get_size(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                for (std::size_t i = 0; more_ && i < size; ++i)
                {
                    std::size_t dim = get_size(ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return;
                    }
                    shape_.push_back(dim);
                }
                break;
            }
        }
    }